

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_515ef::RegexExpr<wchar_t>::parse(RegexExpr<wchar_t> *this,Context *con)

{
  ParserPosition *pPVar1;
  iterator *piVar2;
  int *piVar3;
  Input *pIVar4;
  Index IVar5;
  Input *pIVar6;
  element_type *peVar7;
  ulong uVar8;
  ulong uVar9;
  iterator __begin;
  iterator __end;
  iterator __begin_00;
  iterator __end_00;
  Index IVar10;
  bool bVar11;
  Index IVar12;
  int iVar13;
  bool bVar14;
  sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
  *__it;
  pointer psVar15;
  _Base_type *__range3;
  Input *pIVar16;
  Input *pIVar17;
  vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  local_118;
  Input *pIStack_100;
  Index local_f8;
  Index local_e8;
  Input *local_e0;
  _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
  __executor;
  
  IVar12 = CONCAT44(__executor._M_current.s.idx._4_4_,(uint)__executor._M_current.s.idx);
  pPVar1 = &con->position;
  pIVar4 = (pPVar1->it).buffer;
  IVar5 = (con->position).it.idx;
  __begin_00 = pPVar1->it;
  __begin = pPVar1->it;
  piVar2 = &con->finish;
  pIVar6 = piVar2->buffer;
  pIVar16 = (Input *)(con->finish).idx;
  __end_00 = *piVar2;
  __end = *piVar2;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIStack_100 = (Input *)0x0;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = 0xffffffffffffffff;
  peVar7 = (this->r)._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<wchar_t>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar7 == (element_type *)0x0) {
    bVar14 = false;
  }
  else {
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xffffffffffffffff;
    __executor._M_cur_results.
    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __executor._M_current.s.buffer = (Input *)0xffffffffffffffff;
    __executor._M_current.s.idx._0_4_ = (uint)__executor._M_current.s.idx & 0xffffff00;
    pIStack_100 = pIVar4;
    local_f8 = IVar5;
    std::
    vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
    ::assign(&local_118,(ulong)((int)(peVar7->super__NFA_base)._M_subexpr_count + 3),
             (value_type *)&__executor);
    local_e8 = IVar5;
    local_e0 = pIVar4;
    if (((this->r)._M_flags & 0x400) == 0) {
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
      ::_Executor((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                   *)&__executor,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end,&local_118,
                  &this->r,0x40);
      __executor._M_current.s.buffer =
           (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,__executor._M_begin.s.buffer._0_4_);
      __executor._M_current.s.idx._0_4_ = (undefined4)__executor._M_begin.s.idx;
      __executor._M_current.s.idx._4_4_ = __executor._M_begin.s.idx._4_4_;
      bVar14 = std::__detail::
               _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
               ::_M_main_dispatch();
      if (!bVar14) {
        if (((ulong)__executor._M_states._M_visited_states._M_t.
                    super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                    super__Head_base<0UL,_bool_*,_false>._M_head_impl & 0x40) != 0) {
          bVar14 = false;
          goto LAB_0012e44a;
        }
        __executor._M_states._M_visited_states._M_t.
        super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
        super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
        super__Head_base<0UL,_bool_*,_false>._M_head_impl =
             (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
             ((ulong)__executor._M_states._M_visited_states._M_t.
                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                     super__Head_base<0UL,_bool_*,_false>._M_head_impl | 0x80);
        do {
          bVar11 = (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                     __executor._M_begin.s.buffer._0_4_) ==
                   __executor._M_end.s.buffer;
          bVar14 = __executor._M_end.s.idx != __executor._M_begin.s.idx || !bVar11;
          if (__executor._M_end.s.idx == __executor._M_begin.s.idx && bVar11) goto LAB_0012e44a;
          __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
          __executor._M_current.s.buffer =
               (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                 __executor._M_begin.s.buffer._0_4_);
          __executor._M_current.s.idx = __executor._M_begin.s.idx;
          bVar14 = std::__detail::
                   _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                   ::_M_main_dispatch((_Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_true>
                                       *)&__executor);
        } while (!bVar14);
      }
      bVar14 = true;
    }
    else {
      std::__detail::
      _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
      ::_Executor(&__executor,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__begin_00,
                  (IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>)__end_00,
                  &local_118,&this->r,0x40);
      __executor._M_current.s.buffer =
           (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,__executor._M_begin.s.buffer._0_4_);
      __executor._M_current.s.idx._0_4_ = (undefined4)__executor._M_begin.s.idx;
      __executor._M_current.s.idx._4_4_ = __executor._M_begin.s.idx._4_4_;
      bVar14 = std::__detail::
               _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
               ::_M_main_dispatch();
      if (bVar14) {
LAB_0012e341:
        bVar14 = true;
      }
      else {
        if ((__executor._M_flags & 0x40) == 0) {
          __executor._M_flags = __executor._M_flags | 0x80;
          do {
            bVar11 = (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                       __executor._M_begin.s.buffer._0_4_) ==
                     __executor._M_end.s.buffer;
            bVar14 = __executor._M_end.s.idx != __executor._M_begin.s.idx || !bVar11;
            if (__executor._M_end.s.idx == __executor._M_begin.s.idx && bVar11) goto LAB_0012e41f;
            __executor._M_begin.s.idx = __executor._M_begin.s.idx + 1;
            __executor._M_current.s.buffer =
                 (Input *)CONCAT44(__executor._M_begin.s.buffer._4_4_,
                                   __executor._M_begin.s.buffer._0_4_);
            __executor._M_current.s.idx = __executor._M_begin.s.idx;
            bVar14 = std::__detail::
                     _Executor<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>,_std::__cxx11::regex_traits<wchar_t>,_false>
                     ::_M_main_dispatch(&__executor);
          } while (!bVar14);
          goto LAB_0012e341;
        }
        bVar14 = false;
      }
LAB_0012e41f:
      if ((__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)
          __executor._M_states._M_visited_states._M_t.
          super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)0x0) {
        operator_delete__((void *)__executor._M_states._M_visited_states._M_t.
                                  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                  super__Head_base<0UL,_bool_*,_false>._M_head_impl);
      }
      __executor._M_states._M_visited_states._M_t.
      super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
      super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
      super__Head_base<0UL,_bool_*,_false>._M_head_impl =
           (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
           (__uniq_ptr_impl<bool,_std::default_delete<bool[]>_>)0x0;
      std::
      vector<std::pair<long,_std::vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>_>,_std::allocator<std::pair<long,_std::vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>_>_>_>
      ::~vector(&__executor._M_states._M_match_queue);
    }
LAB_0012e44a:
    if (__executor._M_rep_count.
        super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_rep_count.
                      super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_rep_count.
                            super__Vector_base<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>,_std::allocator<std::pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pIVar4 = local_e0;
    IVar5 = local_e8;
    IVar12 = __executor._M_current.s.idx;
    if (__executor._M_cur_results.
        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(__executor._M_cur_results.
                      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)__executor._M_cur_results.
                            super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      IVar12 = __executor._M_current.s.idx;
    }
    __executor._M_current.s.idx._4_4_ = (undefined4)(IVar12 >> 0x20);
    __executor._M_current.s.idx._0_4_ = (uint)IVar12;
    psVar15 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (bVar14 == false) {
      __executor._M_current.s.idx._0_4_ = (uint)__executor._M_current.s.idx & 0xffffff00;
      __executor._M_cur_results.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar6;
      __executor._M_cur_results.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)pIVar16;
      __executor._M_cur_results.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pIVar6;
      __executor._M_current.s.buffer = pIVar16;
      std::
      vector<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ::assign(&local_118,3,(value_type *)&__executor);
      IVar12 = CONCAT44(__executor._M_current.s.idx._4_4_,(uint)__executor._M_current.s.idx);
    }
    else {
      for (; psVar15 !=
             local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; psVar15 = psVar15 + 1) {
        if (psVar15->matched == false) {
          (psVar15->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).second.s.buffer = pIVar6;
          (psVar15->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).second.s.idx = (Index)pIVar16;
          (psVar15->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).first.s.buffer =
               (psVar15->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).second.s.buffer;
          (psVar15->
          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
          ).first.s.idx =
               (psVar15->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).second.s.idx;
        }
      }
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.buffer = pIVar4;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.idx = IVar5;
      IVar10 = ((local_118.
                 super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).first.s.idx;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.buffer =
           ((local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
           ).first.s.buffer;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-2].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.idx = IVar10;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-2].matched =
           IVar5 != local_118.
                    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-2].
                    super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                    .second.s.idx ||
           pIVar4 != local_118.
                     super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-2].
                     super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                     .second.s.buffer;
      IVar5 = ((local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
              ).second.s.idx;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.buffer =
           ((local_118.
             super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
           ).second.s.buffer;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .first.s.idx = IVar5;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.buffer = pIVar6;
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
      .second.s.idx = (Index)pIVar16;
      pIVar16 = (Input *)((ulong)pIVar16 ^
                          local_118.
                          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                          .first.s.idx |
                         (ulong)pIVar6 ^
                         (ulong)local_118.
                                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].
                                super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                                .first.s.buffer);
      local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].matched = pIVar16 != (Input *)0x0;
    }
  }
  if (bVar14 != false) {
    psVar15 = local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_118.
              super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x78) {
      psVar15 = local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    if (local_118.
        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_118.
        super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      psVar15 = local_118.
                super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -3;
    }
    if (psVar15->matched == true) {
      pIVar4 = (psVar15->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).first.s.buffer;
      uVar8 = (psVar15->
              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
              ).first.s.idx;
      pIVar6 = (psVar15->
               super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
               ).second.s.buffer;
      uVar9 = (psVar15->
              super_pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
              ).second.s.idx;
      if (uVar8 != uVar9 || pIVar4 != pIVar6) {
        pIVar16 = (Input *)0x0;
        do {
          do {
            pIVar17 = pIVar16;
            pIVar16 = (Input *)((long)&(((pair<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>,_(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>
                                          *)&pIVar17->_vptr_Input)->first).s.buffer + 1);
          } while (pIVar4 != pIVar6);
        } while ((Input *)(~uVar8 + uVar9) != pIVar17);
        goto LAB_0012e5b4;
      }
    }
    pIVar16 = (Input *)0x0;
  }
LAB_0012e5b4:
  if (local_118.
      super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    __executor._M_current.s.idx = IVar12;
    operator_delete(local_118.
                    super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>,_std::allocator<std::__cxx11::sub_match<(anonymous_namespace)::IteratorAdaptor<pegmatite::Input::iterator,_wchar_t,_char32_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  uVar8 = (con->position).it.idx;
  if (bVar14 == false) {
    if ((con->error_pos).it.idx < uVar8) {
      iVar13 = (con->position).col;
      (con->error_pos).line = (con->position).line;
      (con->error_pos).col = iVar13;
      IVar5 = (con->position).it.idx;
      (con->error_pos).it.buffer = (con->position).it.buffer;
      (con->error_pos).it.idx = IVar5;
    }
  }
  else {
    (con->position).it.idx = (long)pIVar16->local_buffer + (uVar8 - 0x40);
    piVar3 = &(con->position).col;
    *piVar3 = *piVar3 + (int)pIVar16;
  }
  return bVar14;
}

Assistant:

bool parse(Context &con) const
	{
		size_t length;
		if (regexMatch(con.position.it, con.finish, r, length))
		{
			con.consume(length);
			return true;
		}
		con.set_error_pos();
		return false;
	}